

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShellIntrinsics.cpp
# Opt level: O3

IntrinsicResult intrinsic_keyAvailable(Context *context,IntrinsicResult partialResult)

{
  long *plVar1;
  Value local_18;
  
  MiniScript::KeyAvailable();
  (context->code).ls = (ListStorage<MiniScript::TACLine> *)0x0;
  MiniScript::IntrinsicResult::ensureStorage((IntrinsicResult *)context);
  MiniScript::Value::operator=
            ((Value *)&(((context->code).ls)->super_SimpleVector<MiniScript::TACLine>).mBuf,
             &local_18);
  *(undefined1 *)&(((context->code).ls)->super_SimpleVector<MiniScript::TACLine>).mBlockItems = 1;
  if ((Temp < local_18.type) && (local_18.data.ref != (RefCountedStorage *)0x0)) {
    plVar1 = &(local_18.data.ref)->refCount;
    *plVar1 = *plVar1 + -1;
    if (*plVar1 == 0) {
      (*(local_18.data.ref)->_vptr_RefCountedStorage[1])();
    }
  }
  return (IntrinsicResult)(IntrinsicResultStorage *)context;
}

Assistant:

static IntrinsicResult intrinsic_keyAvailable(Context *context, IntrinsicResult partialResult) {
	return IntrinsicResult(KeyAvailable());
}